

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O1

void __thiscall
s2builderutil::S2PolygonLayer::AppendS2Loops
          (S2PolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  int *piVar1;
  VType VVar2;
  S2Loop *pSVar3;
  Vector3<double> *__args;
  vector<int,_std::allocator<int>_> *__range2;
  pointer pvVar4;
  int *piVar5;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Debug local_69;
  Vector3<double> *local_68;
  iterator iStack_60;
  Vector3<double> *local_58;
  S2Loop *local_50;
  pointer local_48;
  vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
  *local_40;
  S2PolygonLayer *local_38;
  
  local_68 = (Vector3<double> *)0x0;
  iStack_60._M_current = (Vector3<double> *)0x0;
  local_58 = (Vector3<double> *)0x0;
  pvVar4 = (edge_loops->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (edge_loops->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
              *)loops;
  local_38 = this;
  if (pvVar4 != local_48) {
    do {
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68,
                 (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
      piVar1 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar5 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
        __args = (g->vertices_->
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
                 super__Vector_impl_data._M_start +
                 (g->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start[*piVar5].first;
        if (iStack_60._M_current == local_58) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>
                    ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_68,iStack_60,
                     __args);
        }
        else {
          (iStack_60._M_current)->c_[2] = __args->c_[2];
          VVar2 = __args->c_[1];
          (iStack_60._M_current)->c_[0] = __args->c_[0];
          (iStack_60._M_current)->c_[1] = VVar2;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      local_69 = S2Polygon::s2debug_override(local_38->polygon_);
      absl::
      make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>&,S2Debug>
                ((absl *)&local_50,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68,&local_69);
      std::
      vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
      ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                (local_40,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_50);
      pSVar3 = local_50;
      if (local_50 != (S2Loop *)0x0) {
        S2Loop::~S2Loop(local_50);
        operator_delete(pSVar3);
      }
      if (iStack_60._M_current != local_68) {
        iStack_60._M_current = local_68;
      }
      pvVar4 = pvVar4 + 1;
    } while (pvVar4 != local_48);
  }
  if (local_68 != (Vector3<double> *)0x0) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void S2PolygonLayer::AppendS2Loops(const Graph& g,
                                   const vector<Graph::EdgeLoop>& edge_loops,
                                   vector<unique_ptr<S2Loop>>* loops) const {
  vector<S2Point> vertices;
  for (const auto& edge_loop : edge_loops) {
    vertices.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      vertices.push_back(g.vertex(g.edge(edge_id).first));
    }
    loops->push_back(
        make_unique<S2Loop>(vertices, polygon_->s2debug_override()));
    vertices.clear();
  }
}